

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool upb_inttable_remove(upb_inttable *t,uintptr_t key,upb_value *val)

{
  _Bool _Var1;
  uint32_t hash;
  upb_value *puVar2;
  lookupkey_t key_00;
  _Bool local_21;
  _Bool success;
  upb_value *val_local;
  uintptr_t key_local;
  upb_inttable *t_local;
  
  if (key < t->array_size) {
    _Var1 = upb_inttable_arrhas(t,key);
    if (_Var1) {
      t->array_count = t->array_count - 1;
      if (val != (upb_value *)0x0) {
        val->val = t->array[key].val;
      }
      puVar2 = mutable_array(t);
      puVar2[key].val = 0xffffffffffffffff;
      t->presence_mask[key >> 3] =
           t->presence_mask[key >> 3] & ((byte)(1 << ((byte)key & 7)) ^ 0xff);
      local_21 = true;
    }
    else {
      local_21 = false;
    }
  }
  else {
    key_00 = intkey(key);
    hash = upb_inthash(key);
    local_21 = rm(&t->t,key_00,val,hash,inteql);
  }
  check(t);
  return local_21;
}

Assistant:

bool upb_inttable_remove(upb_inttable* t, uintptr_t key, upb_value* val) {
  bool success;
  if (key < t->array_size) {
    if (upb_inttable_arrhas(t, key)) {
      t->array_count--;
      if (val) {
        *val = t->array[key];
      }
      mutable_array(t)[key] = kInttableSentinel;
      ((uint8_t*)t->presence_mask)[key / 8] &= ~(1 << (key % 8));
      success = true;
    } else {
      success = false;
    }
  } else {
    success = rm(&t->t, intkey(key), val, upb_inthash(key), &inteql);
  }
  check(t);
  return success;
}